

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall JetHead::Socket::close(Socket *this,int __fd)

{
  int iVar1;
  ErrCode EVar2;
  int *piVar3;
  int iVar4;
  
  if (this->mFd == -1) {
    iVar4 = 0xc;
  }
  else {
    iVar4 = 0;
    setConnected(this,false,1);
    iVar1 = ::close(this->mFd);
    this->mFd = -1;
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      EVar2 = getErrorCode(*piVar3);
      return EVar2;
    }
  }
  return iVar4;
}

Assistant:

JetHead::ErrCode Socket::close()
{
	int res = 0;
	if ( mFd != -1 )
	{
		setConnected( false );
		res = ::close( mFd );
		mFd = -1;
		if ( res == -1 )
			return getErrorCode( errno );
	}
	else
		return JetHead::kNotInitialized;
	
	return JetHead::kNoError;
}